

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

size_t get_next_version_component(char **str,component_t *component,int flags)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  char *cur;
  byte *pbVar6;
  char *pcVar7;
  size_t sVar8;
  
  pbVar6 = (byte *)*str;
  bVar3 = *pbVar6;
  while ((((byte)(bVar3 - 0x3a) < 0xf6 && (bVar3 != 0)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))))
  {
    pbVar1 = pbVar6 + 1;
    pbVar6 = pbVar6 + 1;
    bVar3 = *pbVar1;
  }
  *str = (char *)pbVar6;
  bVar3 = *pbVar6;
  if (bVar3 == 0) {
    uVar5 = 0;
    if ((flags & 4U) == 0) {
      uVar5 = (flags & 8U) >> 1 | 2;
    }
    component->metaorder = uVar5;
    component->start = "";
    component->end = "";
    sVar8 = 1;
  }
  else {
    if ((byte)((bVar3 & 0xdf) + 0xa5) < 0xe6) {
      while (bVar3 == 0x30) {
        bVar3 = pbVar6[1];
        pbVar6 = pbVar6 + 1;
      }
      *str = (char *)pbVar6;
      component->start = (char *)pbVar6;
      pcVar7 = *str + -1;
      do {
        pcVar2 = pcVar7 + 1;
        pcVar7 = pcVar7 + 1;
      } while (0xf5 < (byte)(*pcVar2 - 0x3aU));
      *str = pcVar7;
      component->end = pcVar7;
      iVar4 = (uint)(pcVar7 != component->start) * 2 + 2;
    }
    else {
      component->start = (char *)pbVar6;
      pcVar7 = *str + -1;
      do {
        pbVar6 = (byte *)(pcVar7 + 1);
        pcVar7 = pcVar7 + 1;
      } while (0xe5 < (byte)((*pbVar6 & 0xdf) + 0xa5));
      *str = pcVar7;
      component->end = pcVar7;
      iVar4 = classify_keyword(component->start,pcVar7,flags);
      if (iVar4 == 2) {
        iVar4 = 3;
      }
      else if (iVar4 != 1) {
        iVar4 = (flags & 2U) + 1;
      }
    }
    component->metaorder = iVar4;
    pbVar6 = (byte *)*str;
    sVar8 = 1;
    if (0xe5 < (byte)((*pbVar6 & 0xdf) + 0xa5)) {
      component[1].start = (char *)pbVar6;
      pcVar7 = *str + -1;
      do {
        pbVar1 = (byte *)(pcVar7 + 1);
        pcVar7 = pcVar7 + 1;
      } while (0xe5 < (byte)((*pbVar1 & 0xdf) + 0xa5));
      component[1].end = pcVar7;
      if ((byte)(*pcVar7 - 0x3aU) < 0xf6) {
        uVar5 = classify_keyword((char *)pbVar6,pcVar7,flags);
        component[1].metaorder = *(int *)(&DAT_00102028 + (ulong)uVar5 * 4);
        *str = pcVar7;
        sVar8 = 2;
      }
    }
  }
  return sVar8;
}

Assistant:

size_t get_next_version_component(const char** str, component_t* component, int flags) {
	*str = skip_separator(*str);

	if (**str == '\0') {
		make_default_component(component, flags);
		return 1;
	}

	parse_token_to_component(str, component, flags);

	/* Special case for letter suffix:
	 * - We taste whether the next component is alpha not followed by a number,
	 *   e.g 1a, 1a.1, but not 1a1
	 * - We check whether it's known keyword (in which case it's treated normally)
	 * - Otherwise, it's treated as letter suffix
	 */
	if (my_isalpha(**str)) {
		++component;

		component->start = *str;
		component->end = skip_alpha(*str);

		if (!my_isnumber(*component->end)) {
			switch (classify_keyword(component->start, component->end, flags)) {
			case KEYWORD_UNKNOWN:
				component->metaorder = METAORDER_LETTER_SUFFIX;
				break;
			case KEYWORD_PRE_RELEASE:
				component->metaorder = METAORDER_PRE_RELEASE;
				break;
			case KEYWORD_POST_RELEASE:
				component->metaorder = METAORDER_POST_RELEASE;
				break;
			}

			*str = component->end;
			return 2;
		}
	}

	return 1;
}